

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::StructElement::~StructElement(StructElement *this)

{
  (this->super_Expression).super_Object._vptr_Object = (_func_int **)&PTR__StructElement_002fc3f8;
  std::__cxx11::string::~string((string *)&this->memberName);
  Object::~Object((Object *)this);
  return;
}

Assistant:

StructElement() = delete;